

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::ObmcSadTest_ExtremeValues_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::ObmcSadTest_ExtremeValues_Test> *this)

{
  Test *this_00;
  
  WithParamInterface<libaom_test::FuncParam<unsigned_int(*)(unsigned_char_const*,int,int_const*,int_const*)>>
  ::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x38);
  anon_unknown.dwarf_1b52ba8::ObmcSadTest::ObmcSadTest((ObmcSadTest *)this_00);
  (((FunctionEquivalenceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_const_int_*,_const_int_*)>
     *)&this_00->_vptr_Test)->
  super_TestWithParam<libaom_test::FuncParam<unsigned_int_(*)(const_unsigned_char_*,_int,_const_int_*,_const_int_*)>_>
  ).super_Test._vptr_Test = (_func_int **)&PTR__TestWithParam_00f56590;
  this_00[1]._vptr_Test = (_func_int **)&DAT_00f565d0;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }